

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_file.hpp
# Opt level: O0

bool iutest::detail::IFileSystem::ReadAll(char *filename,string *dst)

{
  bool bVar1;
  string local_48 [32];
  IFile *local_28;
  IFile *fp;
  string *dst_local;
  char *filename_local;
  
  fp = (IFile *)dst;
  dst_local = (string *)filename;
  local_28 = New();
  if (local_28 == (IFile *)0x0) {
    filename_local._7_1_ = false;
  }
  else {
    bVar1 = IFile::Open(local_28,(char *)dst_local,1);
    if (bVar1) {
      (*(local_28->super_IInStream)._vptr_IInStream[4])(local_48,&local_28->super_IInStream);
      std::__cxx11::string::operator=((string *)fp,local_48);
      std::__cxx11::string::~string(local_48);
      Free(local_28);
      filename_local._7_1_ = true;
    }
    else {
      Free(local_28);
      filename_local._7_1_ = false;
    }
  }
  return filename_local._7_1_;
}

Assistant:

static bool ReadAll(const char* filename, ::std::string& dst)
    {
        IFile* fp = detail::IFileSystem::New();
        if(fp == NULL)
        {
            return false;
        }

        if(!fp->Open(filename, IFile::OpenRead))
        {
            detail::IFileSystem::Free(fp);
            return false;
        }

        dst = fp->ReadAll();
        detail::IFileSystem::Free(fp);
        return true;
    }